

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O1

bool __thiscall
ViconCGStreamIO::VBuffer::
Read<unsigned_int,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
          (VBuffer *this,
          map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
          *o_rValues)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  bool bVar4;
  int iVar5;
  bool bVar6;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> Value;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_98;
  pair<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  local_68;
  
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::clear(&o_rValues->_M_t);
  uVar1 = (this->m_BufferImpl).m_Offset;
  puVar3 = (this->m_BufferImpl).m_Buffer.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->m_BufferImpl).m_Buffer.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar3) < (ulong)uVar1 + 4) {
    bVar6 = false;
  }
  else {
    iVar5 = *(int *)(puVar3 + uVar1);
    (this->m_BufferImpl).m_Offset = uVar1 + 4;
    bVar6 = iVar5 == 0;
    if (!bVar6) {
      do {
        uVar1 = (this->m_BufferImpl).m_Offset;
        puVar3 = (this->m_BufferImpl).m_Buffer.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->m_BufferImpl).m_Buffer.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar3) < (ulong)uVar1 + 4) {
          return bVar6;
        }
        uVar2 = *(uint *)(puVar3 + uVar1);
        (this->m_BufferImpl).m_Offset = uVar1 + 4;
        local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_98._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_98._M_impl.super__Rb_tree_header._M_header;
        local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_98._M_impl.super__Rb_tree_header._M_header._M_right =
             local_98._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar4 = Read<unsigned_int>(this,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                         *)&local_98);
        if (!bVar4) {
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree(&local_98);
          return bVar6;
        }
        local_68.first = uVar2;
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_Rb_tree(&local_68.second._M_t,&local_98);
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>,std::_Select1st<std::pair<unsigned_int_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>>
        ::
        _M_emplace_unique<std::pair<unsigned_int,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>
                  ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>,std::_Select1st<std::pair<unsigned_int_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>>
                    *)o_rValues,&local_68);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree(&local_68.second._M_t);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree(&local_98);
        if (!bVar4) {
          return bVar6;
        }
        iVar5 = iVar5 + -1;
        bVar6 = iVar5 == 0;
      } while (!bVar6);
    }
  }
  return bVar6;
}

Assistant:

bool Read( std::map< K, V > & o_rValues ) const
  {
    o_rValues.clear();
    ViconCGStreamType::UInt32 Size = 0;
    if( !m_BufferImpl.ReadPod( Size ) )
    {
      return false;
    }
    for( ViconCGStreamType::UInt32 Index = 0; Index != Size; ++Index )
    {
      K Key;
      if( !Read( Key ) )
      {
        return false;
      }
      V Value;
      if( !Read( Value ) )
      {
        return false;
      }
      o_rValues.insert( std::make_pair( Key, Value ) );
    }
    return true;
  }